

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Pass * __thiscall asmjit::_abi_1_10::BaseBuilder::passByName(BaseBuilder *this,char *name)

{
  Pass *this_00;
  int iVar1;
  const_iterator ppPVar2;
  char *__s1;
  char *in_RSI;
  Pass *pass;
  const_iterator __end2;
  const_iterator __begin2;
  ZoneVector<asmjit::_abi_1_10::Pass_*> *__range2;
  ZoneVector<asmjit::_abi_1_10::Pass_*> *in_stack_ffffffffffffffd0;
  const_iterator local_28;
  
  local_28 = ZoneVector<asmjit::_abi_1_10::Pass_*>::begin
                       ((ZoneVector<asmjit::_abi_1_10::Pass_*> *)0x114d78);
  ppPVar2 = ZoneVector<asmjit::_abi_1_10::Pass_*>::end(in_stack_ffffffffffffffd0);
  while( true ) {
    if (local_28 == ppPVar2) {
      return (Pass *)0x0;
    }
    this_00 = *local_28;
    __s1 = Pass::name(this_00);
    iVar1 = strcmp(__s1,in_RSI);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return this_00;
}

Assistant:

ASMJIT_FAVOR_SIZE Pass* BaseBuilder::passByName(const char* name) const noexcept {
  for (Pass* pass : _passes)
    if (strcmp(pass->name(), name) == 0)
      return pass;
  return nullptr;
}